

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSat.c
# Opt level: O1

void Cec2_AddClausesSuper(Gia_Man_t *p,Gia_Obj_t *pNode,Vec_Ptr_t *vSuper,satoko_t *pSat)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  int *piVar5;
  void **ppvVar6;
  int iVar7;
  int *lits;
  long lVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  Gia_Obj_t *pGVar13;
  
  if (((ulong)pNode & 1) != 0) {
    __assert_fail("!Gia_IsComplement(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSat.c"
                  ,0xe8,
                  "void Cec2_AddClausesSuper(Gia_Man_t *, Gia_Obj_t *, Vec_Ptr_t *, satoko_t *)");
  }
  if (((int)(uint)*(undefined8 *)pNode < 0) ||
     (((uint)*(undefined8 *)pNode & 0x1fffffff) == 0x1fffffff)) {
    __assert_fail("Gia_ObjIsAnd( pNode )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSat.c"
                  ,0xe9,
                  "void Cec2_AddClausesSuper(Gia_Man_t *, Gia_Obj_t *, Vec_Ptr_t *, satoko_t *)");
  }
  uVar1 = vSuper->nSize;
  lVar8 = (long)(int)uVar1;
  lits = (int *)malloc(lVar8 * 4 + 4);
  uVar11 = uVar1;
  if (0 < lVar8) {
    lVar9 = 0;
    do {
      pGVar13 = (Gia_Obj_t *)((ulong)vSuper->pArray[lVar9] & 0xfffffffffffffffe);
      pGVar4 = p->pObjs;
      if ((pGVar13 < pGVar4) || (iVar7 = p->nObjs, pGVar4 + iVar7 <= pGVar13)) goto LAB_00644fbd;
      uVar11 = (int)((long)pGVar13 - (long)pGVar4 >> 2) * -0x55555555;
      if (((int)uVar11 < 0) || (iVar2 = (p->vCopies2).nSize, iVar2 <= (int)uVar11))
      goto LAB_00644fdc;
      piVar5 = (p->vCopies2).pArray;
      iVar3 = piVar5[uVar11 & 0x7fffffff];
      if (iVar3 < 0) goto LAB_00644ffb;
      *lits = ((uint)vSuper->pArray[lVar9] & 1) + iVar3 * 2;
      if ((pNode < pGVar4) || (pGVar4 + iVar7 <= pNode)) goto LAB_00644fbd;
      uVar11 = (int)((long)pNode - (long)pGVar4 >> 2) * -0x55555555;
      if (((int)uVar11 < 0) || (iVar2 <= (int)uVar11)) goto LAB_00644fdc;
      iVar7 = piVar5[uVar11 & 0x7fffffff];
      if (iVar7 < 0) goto LAB_00644ffb;
      lits[1] = iVar7 * 2 + 1;
      iVar7 = satoko_add_clause(pSat,lits,2);
      if (iVar7 == 0) {
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSat.c"
                      ,0xf9,
                      "void Cec2_AddClausesSuper(Gia_Man_t *, Gia_Obj_t *, Vec_Ptr_t *, satoko_t *)"
                     );
      }
      lVar9 = lVar9 + 1;
      uVar11 = vSuper->nSize;
    } while (lVar9 < (int)uVar11);
  }
  if ((int)uVar11 < 1) {
LAB_00644f12:
    pGVar4 = p->pObjs;
    if ((pGVar4 <= pNode) && (pNode < pGVar4 + p->nObjs)) {
      uVar11 = (int)((long)pNode - (long)pGVar4 >> 2) * -0x55555555;
      if ((-1 < (int)uVar11) && ((int)uVar11 < (p->vCopies2).nSize)) {
        iVar7 = (p->vCopies2).pArray[uVar11 & 0x7fffffff];
        if (-1 < iVar7) {
          lits[lVar8] = iVar7 * 2;
          iVar7 = satoko_add_clause(pSat,lits,uVar1 + 1);
          if (iVar7 == 0) {
            __assert_fail("RetValue",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSat.c"
                          ,0x10a,
                          "void Cec2_AddClausesSuper(Gia_Man_t *, Gia_Obj_t *, Vec_Ptr_t *, satoko_t *)"
                         );
          }
          if (lits == (int *)0x0) {
            return;
          }
          free(lits);
          return;
        }
LAB_00644ffb:
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12e,"int Abc_Var2Lit(int, int)");
      }
LAB_00644fdc:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
  }
  else {
    ppvVar6 = vSuper->pArray;
    pGVar4 = p->pObjs;
    uVar10 = 0;
    while( true ) {
      pGVar13 = (Gia_Obj_t *)((ulong)ppvVar6[uVar10] & 0xfffffffffffffffe);
      if ((pGVar13 < pGVar4) || (pGVar4 + p->nObjs <= pGVar13)) break;
      uVar12 = (int)((long)pGVar13 - (long)pGVar4 >> 2) * -0x55555555;
      if (((int)uVar12 < 0) || ((p->vCopies2).nSize <= (int)uVar12)) goto LAB_00644fdc;
      iVar7 = (p->vCopies2).pArray[uVar12 & 0x7fffffff];
      if (iVar7 < 0) goto LAB_00644ffb;
      lits[uVar10] = ((uint)ppvVar6[uVar10] & 1) + iVar7 * 2 ^ 1;
      uVar10 = uVar10 + 1;
      if (uVar11 == uVar10) goto LAB_00644f12;
    }
  }
LAB_00644fbd:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Cec2_AddClausesSuper( Gia_Man_t * p, Gia_Obj_t * pNode, Vec_Ptr_t * vSuper, satoko_t * pSat )
{
    int fPolarFlip = 0;
    Gia_Obj_t * pFanin;
    int * pLits, nLits, RetValue, i;
    assert( !Gia_IsComplement(pNode) );
    assert( Gia_ObjIsAnd( pNode ) );
    // create storage for literals
    nLits = Vec_PtrSize(vSuper) + 1;
    pLits = ABC_ALLOC( int, nLits );
    // suppose AND-gate is A & B = C
    // add !A => !C   or   A + !C
    Vec_PtrForEachEntry( Gia_Obj_t *, vSuper, pFanin, i )
    {
        pLits[0] = Abc_Var2Lit(Cec2_ObjSatId(p, Gia_Regular(pFanin)), Gia_IsComplement(pFanin));
        pLits[1] = Abc_Var2Lit(Cec2_ObjSatId(p, pNode), 1);
        if ( fPolarFlip )
        {
            if ( Gia_Regular(pFanin)->fPhase )  pLits[0] = Abc_LitNot( pLits[0] );
            if ( pNode->fPhase )                pLits[1] = Abc_LitNot( pLits[1] );
        }
        RetValue = satoko_add_clause( pSat, pLits, 2 );
        assert( RetValue );
    }
    // add A & B => C   or   !A + !B + C
    Vec_PtrForEachEntry( Gia_Obj_t *, vSuper, pFanin, i )
    {
        pLits[i] = Abc_Var2Lit(Cec2_ObjSatId(p, Gia_Regular(pFanin)), !Gia_IsComplement(pFanin));
        if ( fPolarFlip )
        {
            if ( Gia_Regular(pFanin)->fPhase )  pLits[i] = Abc_LitNot( pLits[i] );
        }
    }
    pLits[nLits-1] = Abc_Var2Lit(Cec2_ObjSatId(p, pNode), 0);
    if ( fPolarFlip )
    {
        if ( pNode->fPhase )  pLits[nLits-1] = Abc_LitNot( pLits[nLits-1] );
    }
    RetValue = satoko_add_clause( pSat, pLits, nLits );
    assert( RetValue );
    ABC_FREE( pLits );
}